

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZipCompressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::ZipCompressor::compress(ZipCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  int iVar1;
  
  if (inSize == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = Zip::compress(&this->_zip,inPtr,inSize,this->_outBuffer);
  }
  *outPtr = this->_outBuffer;
  return iVar1;
}

Assistant:

int
ZipCompressor::compress (const char *inPtr,
			 int inSize,
			 int minY,
			 const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    int outSize = _zip.compress(inPtr, inSize, _outBuffer);

    outPtr = _outBuffer;
    return outSize;
}